

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O3

S2CellId __thiscall S2CellId::advance(S2CellId *this,int64 steps)

{
  long lVar1;
  byte bVar2;
  S2CellId SVar3;
  ulong uVar4;
  ulong uVar5;
  S2LogMessage SStack_18;
  
  SVar3 = (S2CellId)this->id_;
  if (steps != 0) {
    if (SVar3.id_ == 0) {
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                 ,0x223,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_18.stream_,"Check failed: id_ != 0 ",0x17);
      abort();
    }
    lVar1 = 0;
    if (SVar3.id_ != 0) {
      for (; (SVar3.id_ >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    bVar2 = (byte)lVar1;
    if (steps < 0) {
      uVar5 = SVar3.id_ >> (bVar2 & 0x3f | 1);
      uVar4 = -uVar5;
      if (-steps == uVar5 || (long)uVar4 < steps) {
        uVar4 = steps;
      }
    }
    else {
      uVar4 = 0xc000000000000000 - (SVar3.id_ - 1 & SVar3.id_) >> (bVar2 & 0x3f | 1);
      if ((ulong)steps <= uVar4) {
        uVar4 = steps;
      }
    }
    SVar3.id_ = SVar3.id_ + (uVar4 << (bVar2 & 0x3f | 1));
  }
  return (S2CellId)SVar3.id_;
}

Assistant:

S2CellId S2CellId::advance(int64 steps) const {
  if (steps == 0) return *this;

  // We clamp the number of steps if necessary to ensure that we do not
  // advance past the End() or before the Begin() of this level.  Note that
  // min_steps and max_steps always fit in a signed 64-bit integer.

  int step_shift = 2 * (kMaxLevel - level()) + 1;
  if (steps < 0) {
    int64 min_steps = -static_cast<int64>(id_ >> step_shift);
    if (steps < min_steps) steps = min_steps;
  } else {
    int64 max_steps = (kWrapOffset + lsb() - id_) >> step_shift;
    if (steps > max_steps) steps = max_steps;
  }
  // If steps is negative, then shifting it left has undefined behavior.
  // Cast to uint64 for a 2's complement answer.
  return S2CellId(id_ + (static_cast<uint64>(steps) << step_shift));
}